

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# big_collective.hpp
# Opt level: O2

void mxx::impl::all2allv_big<unsigned_int>
               (uint *msgs,vector<unsigned_long,_std::allocator<unsigned_long>_> *send_sizes,
               uint *out,vector<unsigned_long,_std::allocator<unsigned_long>_> *recv_sizes,
               comm *comm)

{
  unsigned_long uVar1;
  MPI_Comm poVar2;
  ulong uVar3;
  comm *pcVar4;
  MPI_Datatype poVar5;
  int iVar6;
  MPI_Request *ppoVar7;
  int iVar8;
  int iVar9;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__stat_loc;
  datatype local_d0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_b8;
  comm *local_b0;
  datatype dt;
  requests reqs;
  vector<unsigned_long,_std::allocator<unsigned_long>_> recv_displs;
  vector<unsigned_long,_std::allocator<unsigned_long>_> send_displs;
  
  iVar6 = (int)((ulong)((long)(send_sizes->
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                              _M_impl.super__Vector_impl_data._M_finish -
                       (long)(send_sizes->
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                             _M_impl.super__Vector_impl_data._M_start) >> 3);
  local_b8 = send_sizes;
  if (comm->m_size != iVar6) {
    assert_fail("static_cast<int>(send_sizes.size()) == comm.size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/ext/mxx/include/mxx/big_collective.hpp"
                ,0x111,"all2allv_big");
    iVar6 = comm->m_size;
  }
  if (iVar6 != (int)((ulong)((long)(recv_sizes->
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   )._M_impl.super__Vector_impl_data._M_finish -
                            (long)(recv_sizes->
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)
                                  ._M_impl.super__Vector_impl_data._M_start) >> 3)) {
    assert_fail("static_cast<int>(recv_sizes.size()) == comm.size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/ext/mxx/include/mxx/big_collective.hpp"
                ,0x112,"all2allv_big");
  }
  get_displacements<unsigned_long>(&send_displs,local_b8);
  __stat_loc = recv_sizes;
  get_displacements<unsigned_long>(&recv_displs,recv_sizes);
  reqs._vptr_requests = (_func_int **)&PTR__requests_001b5090;
  reqs.m_requests.super__Vector_base<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  reqs.m_requests.super__Vector_base<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  reqs.m_requests.super__Vector_base<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  iVar9 = 0;
  local_b0 = comm;
  for (iVar6 = 0; pcVar4 = local_b0, iVar8 = local_b0->m_size, iVar6 < iVar8; iVar6 = iVar6 + 1) {
    uVar3 = (long)(local_b0->m_rank + iVar8 + iVar9) % (long)iVar8;
    iVar8 = (int)uVar3;
    local_d0._vptr_datatype = (_func_int **)&PTR__datatype_001b4f50;
    local_d0.mpitype = (MPI_Datatype)&ompi_mpi_unsigned;
    local_d0.builtin = true;
    datatype::contiguous
              (&dt,&local_d0,
               (recv_sizes->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
               _M_impl.super__Vector_impl_data._M_start[iVar8]);
    datatype::~datatype(&local_d0);
    poVar5 = dt.mpitype;
    uVar1 = recv_displs.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start[iVar8];
    poVar2 = pcVar4->mpi_comm;
    ppoVar7 = requests::add(&reqs);
    __stat_loc = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x1;
    MPI_Irecv(out + uVar1,1,poVar5,uVar3 & 0xffffffff,0x3039,poVar2,ppoVar7);
    datatype::~datatype(&dt);
    iVar9 = iVar9 + -1;
  }
  for (iVar6 = 0; pcVar4 = local_b0, iVar6 < iVar8; iVar6 = iVar6 + 1) {
    uVar3 = (long)(local_b0->m_rank + iVar6) % (long)iVar8;
    iVar9 = (int)uVar3;
    local_d0._vptr_datatype = (_func_int **)&PTR__datatype_001b4f50;
    local_d0.mpitype = (MPI_Datatype)&ompi_mpi_unsigned;
    local_d0.builtin = true;
    datatype::contiguous
              (&dt,&local_d0,
               (local_b8->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
               .super__Vector_impl_data._M_start[iVar9]);
    datatype::~datatype(&local_d0);
    poVar5 = dt.mpitype;
    uVar1 = send_displs.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start[iVar9];
    poVar2 = pcVar4->mpi_comm;
    ppoVar7 = requests::add(&reqs);
    __stat_loc = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x1;
    MPI_Isend(msgs + uVar1,1,poVar5,uVar3 & 0xffffffff,0x3039,poVar2,ppoVar7);
    datatype::~datatype(&dt);
    iVar8 = local_b0->m_size;
  }
  requests::wait(&reqs,__stat_loc);
  requests::~requests(&reqs);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&recv_displs.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&send_displs.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  return;
}

Assistant:

void all2allv_big(const T* msgs, const std::vector<size_t>& send_sizes, T* out, const std::vector<size_t>& recv_sizes, const mxx::comm& comm = mxx::comm()) {
    // point-to-point implementation
    // TODO: implement MPI_Alltoallw variant
    // TODO: try RMA
    MXX_ASSERT(static_cast<int>(send_sizes.size()) == comm.size());
    MXX_ASSERT(static_cast<int>(recv_sizes.size()) == comm.size());
    std::vector<size_t> send_displs = get_displacements(send_sizes);
    std::vector<size_t> recv_displs = get_displacements(recv_sizes);
    // TODO: unify tag usage
    int tag = 12345;
    // implementing this using point-to-point communication!
    // dispatch receives
    mxx::requests reqs;
    for (int i = 0; i < comm.size(); ++i) {
        // start with self send/recv
        int recv_from = (comm.rank() + (comm.size()-i)) % comm.size();
        mxx::datatype dt = mxx::get_datatype<T>().contiguous(recv_sizes[recv_from]);
        MPI_Irecv(const_cast<T*>(&(*out)) + recv_displs[recv_from], 1, dt.type(),
                  recv_from, tag, comm, &reqs.add());
    }
    // dispatch sends
    for (int i = 0; i < comm.size(); ++i) {
        int send_to = (comm.rank() + i) % comm.size();
        mxx::datatype dt = mxx::get_datatype<T>().contiguous(send_sizes[send_to]);
        MPI_Isend(const_cast<T*>(msgs)+send_displs[send_to], 1, dt.type(), send_to,
                  tag, comm, &reqs.add());
    }

    reqs.wait();
}